

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QSize __thiscall QMainWindowLayout::sizeHint(QMainWindowLayout *this)

{
  bool bVar1;
  QMainWindowLayoutState *in_RDI;
  long in_FS_OFFSET;
  QSize sbHint;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QSize *in_stack_ffffffffffffffb0;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined1 *local_20;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QSize::isValid((QSize *)in_RDI);
  if (!bVar1) {
    local_18 = QMainWindowLayoutState::sizeHint(in_RDI);
    *(QSize *)&in_RDI[2].toolBarAreaLayout.docks[3].field_0x34 = local_18;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    if (*(long *)&in_RDI[2].toolBarAreaLayout.docks[1].dirty == 0) {
      QSize::QSize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    }
    else {
      local_20 = (undefined1 *)
                 (**(code **)(**(long **)&in_RDI[2].toolBarAreaLayout.docks[1].dirty + 0x10))();
    }
    local_2c = QSize::width((QSize *)0x5f948a);
    local_30 = QSize::width((QSize *)0x5f949f);
    qMax<int>(&local_2c,&local_30);
    QSize::height((QSize *)0x5f94c2);
    QSize::height((QSize *)0x5f94d7);
    QSize::QSize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    *(undefined8 *)&in_RDI[2].toolBarAreaLayout.docks[3].field_0x34 = local_28;
  }
  local_10 = *(QSize *)&in_RDI[2].toolBarAreaLayout.docks[3].field_0x34;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QMainWindowLayout::sizeHint() const
{
    if (!szHint.isValid()) {
        szHint = layoutState.sizeHint();
        const QSize sbHint = statusbar ? statusbar->sizeHint() : QSize(0, 0);
        szHint = QSize(qMax(sbHint.width(), szHint.width()),
                        sbHint.height() + szHint.height());
    }
    return szHint;
}